

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::ProgramBinaryPersistenceRecompileShaderCase::executeForProgram
          (ProgramBinaryPersistenceRecompileShaderCase *this,Program *program,
          ShaderAllocator *shaders)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  Shader *this_01;
  mapped_type *ppSVar2;
  char *__s;
  long *plVar3;
  long *plVar4;
  allocator<char> local_201;
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  long *local_1c0 [2];
  long local_1b0 [2];
  undefined1 local_1a0 [384];
  
  pTVar1 = ((this->super_ProgramBinaryPersistenceCase).super_ProgramBinaryCase.super_TestCase.
            super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1a0._0_4_ = (this->super_ProgramBinaryPersistenceCase).m_shaderType;
  ppSVar2 = std::
            map<glu::ShaderType,_glu::Shader_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_glu::Shader_*>_>_>
            ::operator[](&shaders->m_shaders,(key_type *)local_1a0);
  this_01 = *ppSVar2;
  this_00 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = pTVar1;
  std::__cxx11::ostringstream::ostringstream(this_00);
  __s = glu::getShaderTypeName((this->super_ProgramBinaryPersistenceCase).m_shaderType);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1c0,__s,&local_201);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_1c0,0,(char *)0x0,0xadd899);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_1f0 = *plVar4;
    lStack_1e8 = plVar3[3];
    local_200 = &local_1f0;
  }
  else {
    local_1f0 = *plVar4;
    local_200 = (long *)*plVar3;
  }
  local_1f8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_200);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_1d0 = *plVar4;
    lStack_1c8 = plVar3[3];
    local_1e0 = &local_1d0;
  }
  else {
    local_1d0 = *plVar4;
    local_1e0 = (long *)*plVar3;
  }
  local_1d8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)local_1e0,local_1d8)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  glu::Shader::compile(this_01);
  return;
}

Assistant:

void executeForProgram (glu::Program& program, ShaderAllocator& shaders)
	{
		TestLog&		log			= m_testCtx.getLog();
		glu::Shader&	caseShader	= shaders.get(m_shaderType);

		log << TestLog::Message << "Recompiling " + std::string(getShaderTypeName(m_shaderType)) + " shader" << TestLog::EndMessage;
		caseShader.compile();
		DE_UNREF(program);
	}